

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  pointer pTVar1;
  Type TVar2;
  Result RVar3;
  char *pcVar4;
  ulong uVar5;
  int __c;
  Var *__s;
  Enum EVar6;
  Index IVar7;
  undefined4 local_a0;
  undefined1 local_9c;
  uint64_t local_98;
  undefined7 uStack_90;
  undefined4 uStack_89;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar3 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar3.enum_ == Ok) {
      pcVar4 = Var::index(var,(char *)__s,__c);
      uVar5 = (ulong)pcVar4 & 0xffffffff;
      pTVar1 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar6 = pTVar1[uVar5].element.enum_;
      IVar7 = pTVar1[uVar5].element.type_index_;
      local_98 = pTVar1[uVar5].limits.initial;
      uStack_90 = (undefined7)pTVar1[uVar5].limits.max;
      uStack_89 = *(undefined4 *)((long)&pTVar1[uVar5].limits.max + 7);
      local_9c = pTVar1[uVar5].limits.field_0x17;
      local_a0 = *(undefined4 *)&pTVar1[uVar5].limits.field_0x13;
    }
    else {
      local_a0 = 0;
      local_9c = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_89 = 0;
      EVar6 = Any;
      IVar7 = 0xffffffff;
    }
    TVar2.type_index_ = IVar7;
    TVar2.enum_ = EVar6;
    out->element = TVar2;
    (out->limits).initial = local_98;
    (out->limits).max = CONCAT17((undefined1)uStack_89,uStack_90);
    *(undefined4 *)((long)&(out->limits).max + 7) = uStack_89;
    *(undefined4 *)&(out->limits).field_0x13 = local_a0;
    (out->limits).field_0x17 = local_9c;
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}